

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_fwd_hrefk(jit_State *J)

{
  ushort uVar1;
  uint lim;
  int iVar2;
  AliasRet AVar3;
  TRef TVar4;
  IRIns *pIVar5;
  IRIns *newref;
  IRRef ref;
  IRRef tab;
  jit_State *J_local;
  
  lim = (uint)(J->fold).left[0].field_0.op1;
  uVar1 = J->chain[0x3b];
  do {
    newref._0_4_ = (uint)uVar1;
    if ((uint)newref <= lim) {
      if ((*(char *)((long)(J->cur).ir + (ulong)lim * 8 + 5) == 'R') &&
         (iVar2 = fwd_aa_tab_clear(J,lim,lim), iVar2 != 0)) {
        (J->fold).ins.field_1.t.irt = (J->fold).ins.field_1.t.irt & 0x7f;
      }
LAB_0013170b:
      TVar4 = lj_opt_cse(J);
      return TVar4;
    }
    pIVar5 = (J->cur).ir + (uint)newref;
    if (lim == (pIVar5->field_0).op1) {
      if (((J->fold).right[0].field_0.op1 == (pIVar5->field_0).op2) &&
         (iVar2 = fwd_aa_tab_clear(J,(uint)newref,lim), iVar2 != 0)) {
        return (uint)newref;
      }
      goto LAB_0013170b;
    }
    AVar3 = aa_table(J,lim,(uint)(pIVar5->field_0).op1);
    if (AVar3 != ALIAS_NO) goto LAB_0013170b;
    uVar1 = (pIVar5->field_0).prev;
  } while( true );
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_hrefk(jit_State *J)
{
  IRRef tab = fleft->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > tab) {
    IRIns *newref = IR(ref);
    if (tab == newref->op1) {
      if (fright->op1 == newref->op2 && fwd_aa_tab_clear(J, ref, tab))
	return ref;  /* Forward from NEWREF. */
      else
	goto docse;
    } else if (aa_table(J, tab, newref->op1) != ALIAS_NO) {
      goto docse;
    }
    ref = newref->prev;
  }
  /* No conflicting NEWREF: key location unchanged for HREFK of TDUP. */
  if (IR(tab)->o == IR_TDUP && fwd_aa_tab_clear(J, tab, tab))
    fins->t.irt &= ~IRT_GUARD;  /* Drop HREFK guard. */
docse:
  return CSEFOLD;
}